

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O1

void helper_wrmsr_x86_64(CPUX86State *env)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uintptr_t unaff_retaddr;
  
  cpu_svm_check_intercept_param_x86_64(env,0x7c,1,unaff_retaddr);
  uVar1 = (uint)env->regs[0];
  uVar2 = env->regs[2] << 0x20 | (ulong)uVar1;
  uVar3 = (uint)env->regs[1];
  if (0x1ff < (int)uVar3) {
    if ((int)uVar3 < 0x268) {
      if (uVar3 - 0x200 < 0x10) {
        if ((0x5555U >> (uVar3 - 0x200 & 0x1f) & 1) != 0) {
          env->mtrr_var[uVar3 - 0x200 >> 1].base = uVar2;
          return;
        }
        env->mtrr_var[uVar3 - 0x201 >> 1].mask = uVar2;
        return;
      }
      if (uVar3 - 600 < 2) {
        uVar3 = uVar3 - 599;
LAB_0051bbb1:
        env->mtrr_fixed[uVar3] = uVar2;
        return;
      }
      if (uVar3 == 0x250) {
        env->mtrr_fixed[0] = uVar2;
        return;
      }
    }
    else if ((int)uVar3 < 0x277) {
      if (uVar3 - 0x268 < 8) {
        uVar3 = uVar3 - 0x265;
        goto LAB_0051bbb1;
      }
    }
    else {
      if (uVar3 == 0x277) {
        env->pat = uVar2;
        return;
      }
      if (uVar3 == 0x2ff) {
        env->mtrr_deftype = uVar2;
        return;
      }
      if (uVar3 == 0xd90) {
        env->msr_bndcfgs = uVar2;
        cpu_sync_bndcs_hflags_x86_64(env);
        return;
      }
    }
    goto switchD_0051bc24_default;
  }
  if ((int)uVar3 < -0x3ffefee9) {
    switch(uVar3) {
    case 0xc0000080:
      uVar3 = (uint)env->features[6];
      uVar5 = (uVar3 & 0x2000000) >> 0xb;
      uVar3 = uVar3 >> 9 & 0x800 | uVar3 >> 0x15 & 0x100 | uVar3 >> 0xb & 1 | uVar5 | uVar5 |
              ((uint)env->features[7] & 4) << 10;
      uVar4 = ~(ulong)uVar3 & env->efer;
      uVar2 = uVar1 & uVar3 | uVar4;
      env->efer = uVar2;
      env->hflags = ((uint)uVar2 & 0x1000) << 8 |
                    ((uint)uVar4 & 0x400) << 4 | env->hflags & 0xffefbfff;
      return;
    case 0xc0000081:
      env->star = uVar2;
      return;
    case 0xc0000082:
      env->lstar = uVar2;
      return;
    case 0xc0000083:
      env->cstar = uVar2;
      return;
    case 0xc0000084:
      env->fmask = uVar2;
      return;
    }
    switch(uVar3) {
    case 0xc0000100:
      env->segs[4].base = uVar2;
      return;
    case 0xc0000101:
      env->segs[5].base = uVar2;
      return;
    case 0xc0000102:
      env->kernelgsbase = uVar2;
      return;
    case 0xc0000103:
      env->tsc_aux = uVar2;
      return;
    }
    goto switchD_0051bc24_default;
  }
  if ((int)uVar3 < 0x174) {
    if (uVar3 == 0xc0010117) {
      env->vm_hsave = uVar2;
      return;
    }
    if (uVar3 == 0x1b) {
      return;
    }
    goto switchD_0051bc24_default;
  }
  switch(uVar3) {
  case 0x174:
    env->sysenter_cs = uVar1 & 0xffff;
    break;
  case 0x175:
    env->sysenter_esp = uVar2;
    break;
  case 0x176:
    env->sysenter_eip = uVar2;
    break;
  case 0x17a:
    env->mcg_status = uVar2;
    break;
  case 0x17b:
    if (((env->mcg_cap & 0x100) != 0) && (uVar2 + 1 < 2)) {
      env->mcg_ctl = uVar2;
    }
    break;
  default:
    if (uVar3 == 0x1a0) {
      env->msr_ia32_misc_enable = uVar2;
      return;
    }
  case 0x177:
  case 0x178:
  case 0x179:
switchD_0051bc24_default:
    if (((0x3ff < uVar3) && (uVar3 < ((uint)env->mcg_cap & 0x3f) * 4 + 0x400)) &&
       (((env->regs[1] & 3) != 0 || (uVar2 + 1 < 2)))) {
      env->mce_banks[uVar3 - 0x400] = uVar2;
    }
  }
  return;
}

Assistant:

void helper_wrmsr(CPUX86State *env)
{
    uint64_t val;

    cpu_svm_check_intercept_param(env, SVM_EXIT_MSR, 1, GETPC());

    val = ((uint32_t)env->regs[R_EAX]) |
        ((uint64_t)((uint32_t)env->regs[R_EDX]) << 32);

    switch ((uint32_t)env->regs[R_ECX]) {
    case MSR_IA32_SYSENTER_CS:
        env->sysenter_cs = val & 0xffff;
        break;
    case MSR_IA32_SYSENTER_ESP:
        env->sysenter_esp = val;
        break;
    case MSR_IA32_SYSENTER_EIP:
        env->sysenter_eip = val;
        break;
    case MSR_IA32_APICBASE:
        // cpu_set_apic_base(env_archcpu(env)->apic_state, val);
        break;
    case MSR_EFER:
        {
            uint64_t update_mask;

            update_mask = 0;
            if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_SYSCALL) {
                update_mask |= MSR_EFER_SCE;
            }
            if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_LM) {
                update_mask |= MSR_EFER_LME;
            }
            if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_FFXSR) {
                update_mask |= MSR_EFER_FFXSR;
            }
            if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_NX) {
                update_mask |= MSR_EFER_NXE;
            }
            if (env->features[FEAT_8000_0001_ECX] & CPUID_EXT3_SVM) {
                update_mask |= MSR_EFER_SVME;
            }
            if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_FFXSR) {
                update_mask |= MSR_EFER_FFXSR;
            }
            cpu_load_efer(env, (env->efer & ~update_mask) |
                          (val & update_mask));
        }
        break;
    case MSR_STAR:
        env->star = val;
        break;
    case MSR_PAT:
        env->pat = val;
        break;
    case MSR_VM_HSAVE_PA:
        env->vm_hsave = val;
        break;
#ifdef TARGET_X86_64
    case MSR_LSTAR:
        env->lstar = val;
        break;
    case MSR_CSTAR:
        env->cstar = val;
        break;
    case MSR_FMASK:
        env->fmask = val;
        break;
    case MSR_FSBASE:
        env->segs[R_FS].base = val;
        break;
    case MSR_GSBASE:
        env->segs[R_GS].base = val;
        break;
    case MSR_KERNELGSBASE:
        env->kernelgsbase = val;
        break;
#endif
    case MSR_MTRRphysBase(0):
    case MSR_MTRRphysBase(1):
    case MSR_MTRRphysBase(2):
    case MSR_MTRRphysBase(3):
    case MSR_MTRRphysBase(4):
    case MSR_MTRRphysBase(5):
    case MSR_MTRRphysBase(6):
    case MSR_MTRRphysBase(7):
        env->mtrr_var[((uint32_t)env->regs[R_ECX] -
                       MSR_MTRRphysBase(0)) / 2].base = val;
        break;
    case MSR_MTRRphysMask(0):
    case MSR_MTRRphysMask(1):
    case MSR_MTRRphysMask(2):
    case MSR_MTRRphysMask(3):
    case MSR_MTRRphysMask(4):
    case MSR_MTRRphysMask(5):
    case MSR_MTRRphysMask(6):
    case MSR_MTRRphysMask(7):
        env->mtrr_var[((uint32_t)env->regs[R_ECX] -
                       MSR_MTRRphysMask(0)) / 2].mask = val;
        break;
    case MSR_MTRRfix64K_00000:
        env->mtrr_fixed[(uint32_t)env->regs[R_ECX] -
                        MSR_MTRRfix64K_00000] = val;
        break;
    case MSR_MTRRfix16K_80000:
    case MSR_MTRRfix16K_A0000:
        env->mtrr_fixed[(uint32_t)env->regs[R_ECX] -
                        MSR_MTRRfix16K_80000 + 1] = val;
        break;
    case MSR_MTRRfix4K_C0000:
    case MSR_MTRRfix4K_C8000:
    case MSR_MTRRfix4K_D0000:
    case MSR_MTRRfix4K_D8000:
    case MSR_MTRRfix4K_E0000:
    case MSR_MTRRfix4K_E8000:
    case MSR_MTRRfix4K_F0000:
    case MSR_MTRRfix4K_F8000:
        env->mtrr_fixed[(uint32_t)env->regs[R_ECX] -
                        MSR_MTRRfix4K_C0000 + 3] = val;
        break;
    case MSR_MTRRdefType:
        env->mtrr_deftype = val;
        break;
    case MSR_MCG_STATUS:
        env->mcg_status = val;
        break;
    case MSR_MCG_CTL:
        if ((env->mcg_cap & MCG_CTL_P)
            && (val == 0 || val == ~(uint64_t)0)) {
            env->mcg_ctl = val;
        }
        break;
    case MSR_TSC_AUX:
        env->tsc_aux = val;
        break;
    case MSR_IA32_MISC_ENABLE:
        env->msr_ia32_misc_enable = val;
        break;
    case MSR_IA32_BNDCFGS:
        /* FIXME: #GP if reserved bits are set.  */
        /* FIXME: Extend highest implemented bit of linear address.  */
        env->msr_bndcfgs = val;
        cpu_sync_bndcs_hflags(env);
        break;
    default:
        if ((uint32_t)env->regs[R_ECX] >= MSR_MC0_CTL
            && (uint32_t)env->regs[R_ECX] < MSR_MC0_CTL +
            (4 * env->mcg_cap & 0xff)) {
            uint32_t offset = (uint32_t)env->regs[R_ECX] - MSR_MC0_CTL;
            if ((offset & 0x3) != 0
                || (val == 0 || val == ~(uint64_t)0)) {
                env->mce_banks[offset] = val;
            }
            break;
        }
        /* XXX: exception? */
        break;
    }
}